

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

int __thiscall
vkt::sr::anon_unknown_0::TextureGatherTests::init(TextureGatherTests *this,EVP_PKEY_CTX *ctx)

{
  WrapMode wrapS;
  WrapMode wrapT;
  ChannelOrder CVar1;
  FilterMode minFilter;
  FilterMode magFilter;
  ChannelType CVar2;
  TestContext *pTVar3;
  TextureFormat TVar4;
  int iVar5;
  TestNode *pTVar6;
  ulong extraout_RAX;
  long lVar7;
  TestNode *pTVar8;
  long *plVar9;
  TestNode *node;
  IVec3 *pIVar10;
  char *pcVar11;
  long *plVar12;
  size_type *psVar13;
  ulong *puVar14;
  OffsetSize OVar15;
  char *pcVar16;
  GatherType gatherType;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  WrapMode *pWVar20;
  long lVar21;
  ulong uVar22;
  TextureSwizzleComponent comp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  bool bVar24;
  bool bVar25;
  string local_3b8;
  OffsetSize local_398;
  TextureType_conflict local_394;
  TestNode *local_390;
  string caseName_1;
  MaybeTextureSwizzle swizzle;
  string local_330;
  int local_30c;
  TestNode *local_308;
  TestNode *local_300;
  IVec3 *local_2f8;
  TestNode *local_2f0;
  undefined1 *local_2e8;
  MaybeTextureSwizzle swizzle_1;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8;
  undefined7 uStack_2b7;
  TestNode *local_2a8;
  TestNode *local_2a0;
  ulong local_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long local_250;
  TestNode *local_248;
  TestNode *local_240;
  long local_238;
  TestNode *local_230;
  long local_228;
  string caseName;
  ios_base local_1b0 [264];
  anon_struct_24_2_3f8e1b6f textureSizes [2];
  anon_struct_16_2_3ce319a5 formats [4];
  
  formats[0].name = "rgba8";
  formats[0].format.order = RGBA;
  formats[0].format.type = UNORM_INT8;
  formats[1].name = "rgba8ui";
  formats[1].format = (TextureFormat)&DAT_1e00000008;
  formats[2].name = "rgba8i";
  formats[2].format.order = RGBA;
  formats[2].format.type = SIGNED_INT8;
  formats[3].name = "depth32f";
  formats[3].format.order = D;
  formats[3].format.type = FLOAT;
  textureSizes[0].name = "size_pot";
  textureSizes[0].size.m_data[0] = 0x40;
  textureSizes[0].size.m_data[1] = 0x40;
  textureSizes[0].size.m_data[2] = 3;
  textureSizes[1].name = "size_npot";
  textureSizes[1].size.m_data[0] = 0x11;
  textureSizes[1].size.m_data[1] = 0x17;
  textureSizes[1].size.m_data[2] = 3;
  local_2e8 = &local_2b8;
  gatherType = GATHERTYPE_BASIC;
  local_390 = (TestNode *)this;
  do {
    pTVar6 = (TestNode *)operator_new(0x70);
    if (gatherType < GATHERTYPE_LAST) {
      pcVar16 = (char *)((long)&DAT_00b25898 + (long)(int)(&DAT_00b25898)[gatherType]);
    }
    else {
      pcVar16 = (char *)0x0;
    }
    if (gatherType < GATHERTYPE_LAST) {
      pcVar11 = (char *)((long)&DAT_00b258a8 + (long)(int)(&DAT_00b258a8)[gatherType]);
    }
    else {
      pcVar11 = (char *)0x0;
    }
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,local_390->m_testCtx,pcVar16,pcVar11);
    local_2a8 = pTVar6;
    tcu::TestNode::addChild(local_390,pTVar6);
    OVar15 = OFFSETSIZE_NONE;
    uVar22 = extraout_RAX;
    do {
      uVar22 = CONCAT71((int7)(uVar22 >> 8),gatherType != GATHERTYPE_BASIC);
      if (((gatherType != GATHERTYPE_BASIC) != (OVar15 == OFFSETSIZE_NONE)) &&
         (uVar22 = (ulong)(gatherType ^ GATHERTYPE_OFFSETS),
         OVar15 != OFFSETSIZE_IMPLEMENTATION_MAXIMUM ||
         (gatherType ^ GATHERTYPE_OFFSETS) != GATHERTYPE_BASIC)) {
        pTVar6 = local_2a8;
        local_398 = OVar15;
        if (OVar15 != OFFSETSIZE_NONE) {
          pTVar6 = (TestNode *)operator_new(0x70);
          pcVar16 = (char *)0x0;
          if (OVar15 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
            pcVar16 = "implementation_offset";
          }
          pcVar11 = (char *)0x0;
          if (OVar15 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
            pcVar11 = "Use offsets within the implementation range";
          }
          if (OVar15 == OFFSETSIZE_MINIMUM_REQUIRED) {
            pcVar16 = "min_required_offset";
            pcVar11 = "Use offsets within Vulkan minimum required range";
          }
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar6,local_390->m_testCtx,pcVar16,pcVar11);
        }
        if (pTVar6 != local_2a8) {
          tcu::TestNode::addChild(local_2a8,pTVar6);
        }
        bVar24 = local_398 != OFFSETSIZE_MINIMUM_REQUIRED;
        lVar7 = 0;
        local_248 = pTVar6;
        do {
          local_394 = (&DAT_00d26cb8)[lVar7 * 4];
          local_238 = lVar7;
          if ((gatherType == GATHERTYPE_BASIC) || (local_394 != TEXTURETYPE_CUBE)) {
            pTVar6 = (TestNode *)operator_new(0x70);
            tcu::TestCaseGroup::TestCaseGroup
                      ((TestCaseGroup *)pTVar6,local_390->m_testCtx,
                       *(char **)(&DAT_00d26cb0 + lVar7 * 0x10),"");
            tcu::TestNode::addChild(local_248,pTVar6);
            lVar7 = 0;
            local_240 = pTVar6;
            do {
              local_250 = lVar7;
              pTVar6 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar6,local_390->m_testCtx,formats[lVar7].name,"");
              local_300 = pTVar6;
              tcu::TestNode::addChild(local_240,pTVar6);
              iVar5 = 0;
              do {
                pTVar6 = local_300;
                pTVar8 = local_300;
                local_30c = iVar5;
                if (iVar5 != 0) {
                  pTVar8 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar8,local_390->m_testCtx,"no_corners",
                             "Test case variants that don\'t sample around cube map corners");
                }
                if (pTVar6 != pTVar8) {
                  tcu::TestNode::addChild(pTVar6,pTVar8);
                }
                local_298 = (ulong)(local_30c != 0);
                lVar17 = 0;
                local_230 = pTVar8;
                do {
                  pTVar6 = local_230;
                  pTVar8 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar8,local_390->m_testCtx,textureSizes[lVar17].name,
                             "");
                  local_2f8 = &textureSizes[lVar17].size;
                  local_2a0 = pTVar8;
                  local_228 = lVar17;
                  tcu::TestNode::addChild(pTVar6,pTVar8);
                  pTVar6 = (TestNode *)0x0;
                  do {
                    uVar19 = (uint)pTVar6;
                    if (((((formats[lVar7].format.order - D & 0xfffffffd) == 0) == (uVar19 != 0)) &&
                        (uVar19 < 4)) && (uVar19 != 2)) {
                      pTVar8 = local_2a0;
                      if (uVar19 != 0) {
                        pTVar8 = (TestNode *)operator_new(0x70);
                        pTVar3 = local_390->m_testCtx;
                        local_2c8 = &local_2b8;
                        local_2c0 = 0;
                        local_2b8 = 0;
                        plVar9 = (long *)std::__cxx11::string::append((char *)&local_2c8);
                        plVar12 = plVar9 + 2;
                        if ((long *)*plVar9 == plVar12) {
                          local_280 = *plVar12;
                          lStack_278 = plVar9[3];
                          local_290 = &local_280;
                        }
                        else {
                          local_280 = *plVar12;
                          local_290 = (long *)*plVar9;
                        }
                        local_288 = plVar9[1];
                        *plVar9 = (long)plVar12;
                        plVar9[1] = 0;
                        *(undefined1 *)(plVar9 + 2) = 0;
                        plVar9 = (long *)std::__cxx11::string::append((char *)&local_290);
                        plVar12 = plVar9 + 2;
                        if ((long *)*plVar9 == plVar12) {
                          local_260 = *plVar12;
                          lStack_258 = plVar9[3];
                          local_270 = &local_260;
                        }
                        else {
                          local_260 = *plVar12;
                          local_270 = (long *)*plVar9;
                        }
                        local_268 = plVar9[1];
                        *plVar9 = (long)plVar12;
                        plVar9[1] = 0;
                        *(undefined1 *)(plVar9 + 2) = 0;
                        tcu::TestCaseGroup::TestCaseGroup
                                  ((TestCaseGroup *)pTVar8,pTVar3,(char *)local_270,"");
                      }
                      if (uVar19 != 0) {
                        if (local_270 != &local_260) {
                          operator_delete(local_270,local_260 + 1);
                        }
                        if (local_290 != &local_280) {
                          operator_delete(local_290,local_280 + 1);
                        }
                        if (local_2c8 != &local_2b8) {
                          operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
                        }
                      }
                      if (pTVar8 != local_2a0) {
                        tcu::TestNode::addChild(local_2a0,pTVar8);
                      }
                      lVar17 = 1;
                      pWVar20 = &DAT_00d26ce8;
                      local_308 = pTVar6;
                      local_2f0 = pTVar8;
                      do {
                        wrapS = *pWVar20;
                        lVar21 = 0;
                        if (lVar17 != 3) {
                          lVar21 = lVar17;
                        }
                        wrapT = (&DAT_00d26ce8)[lVar21 * 4];
                        swizzle.m_swizzle.m_data._0_8_ = &swizzle.m_isSome;
                        swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_R;
                        swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_R;
                        stack0xfffffffffffffcb8 = stack0xfffffffffffffcb8 & 0xffffffffffffff00;
                        plVar9 = (long *)std::__cxx11::string::append((char *)&swizzle);
                        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                        psVar13 = (size_type *)(plVar9 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar9 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar13) {
                          local_3b8.field_2._M_allocated_capacity = *psVar13;
                          local_3b8.field_2._8_8_ = plVar9[3];
                        }
                        else {
                          local_3b8.field_2._M_allocated_capacity = *psVar13;
                          local_3b8._M_dataplus._M_p = (pointer)*plVar9;
                        }
                        local_3b8._M_string_length = plVar9[1];
                        *plVar9 = (long)psVar13;
                        plVar9[1] = 0;
                        *(undefined1 *)(plVar9 + 2) = 0;
                        plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b8);
                        psVar13 = (size_type *)(plVar9 + 2);
                        if ((size_type *)*plVar9 == psVar13) {
                          caseName_1.field_2._M_allocated_capacity = *psVar13;
                          caseName_1.field_2._8_8_ = plVar9[3];
                          caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                        }
                        else {
                          caseName_1.field_2._M_allocated_capacity = *psVar13;
                          caseName_1._M_dataplus._M_p = (pointer)*plVar9;
                        }
                        caseName_1._M_string_length = plVar9[1];
                        *plVar9 = (long)psVar13;
                        plVar9[1] = 0;
                        *(undefined1 *)(plVar9 + 2) = 0;
                        plVar9 = (long *)std::__cxx11::string::append((char *)&caseName_1);
                        caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
                        psVar13 = (size_type *)(plVar9 + 2);
                        if ((size_type *)*plVar9 == psVar13) {
                          caseName.field_2._M_allocated_capacity = *psVar13;
                          caseName.field_2._8_8_ = plVar9[3];
                        }
                        else {
                          caseName.field_2._M_allocated_capacity = *psVar13;
                          caseName._M_dataplus._M_p = (pointer)*plVar9;
                        }
                        caseName._M_string_length = plVar9[1];
                        *plVar9 = (long)psVar13;
                        plVar9[1] = 0;
                        *(undefined1 *)(plVar9 + 2) = 0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                          operator_delete(caseName_1._M_dataplus._M_p,
                                          caseName_1.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                          operator_delete(local_3b8._M_dataplus._M_p,
                                          local_3b8.field_2._M_allocated_capacity + 1);
                        }
                        if ((bool *)swizzle.m_swizzle.m_data._0_8_ != &swizzle.m_isSome) {
                          operator_delete((void *)swizzle.m_swizzle.m_data._0_8_,
                                          stack0xfffffffffffffcb8 + 1);
                        }
                        pTVar3 = local_390->m_testCtx;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&caseName_1,caseName._M_dataplus._M_p,
                                   (allocator<char> *)&local_330);
                        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
                        TVar4 = formats[lVar7].format;
                        swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                        stack0xfffffffffffffcb8 = stack0xfffffffffffffcb8 & 0xffffffffffffff00;
                        pTVar6 = (TestNode *)
                                 makeTextureGatherCase
                                           (local_394,pTVar3,&caseName_1,&local_3b8,gatherType,
                                            local_398,TVar4,(CompareMode)local_308,wrapS,wrapT,
                                            &swizzle,NEAREST,NEAREST,0,local_2f8,(deUint32)local_298
                                            ,IMAGE_BACKING_MODE_REGULAR);
                        tcu::TestNode::addChild(local_2f0,pTVar6);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                          operator_delete(local_3b8._M_dataplus._M_p,
                                          local_3b8.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                          operator_delete(caseName_1._M_dataplus._M_p,
                                          caseName_1.field_2._M_allocated_capacity + 1);
                        }
                        pTVar3 = local_390->m_testCtx;
                        std::operator+(&caseName_1,"sparse_",&caseName);
                        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
                        pTVar6 = local_308;
                        swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                        swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                        stack0xfffffffffffffcb8 = stack0xfffffffffffffcb8 & 0xffffffffffffff00;
                        pTVar8 = (TestNode *)
                                 makeTextureGatherCase
                                           (local_394,pTVar3,&caseName_1,&local_3b8,gatherType,
                                            local_398,TVar4,(CompareMode)local_308,wrapS,wrapT,
                                            &swizzle,NEAREST,NEAREST,0,local_2f8,(deUint32)local_298
                                            ,IMAGE_BACKING_MODE_SPARSE);
                        tcu::TestNode::addChild(local_2f0,pTVar8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                          operator_delete(local_3b8._M_dataplus._M_p,
                                          local_3b8.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                          operator_delete(caseName_1._M_dataplus._M_p,
                                          caseName_1.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)caseName._M_dataplus._M_p != &caseName.field_2) {
                          operator_delete(caseName._M_dataplus._M_p,
                                          caseName.field_2._M_allocated_capacity + 1);
                        }
                        pWVar20 = pWVar20 + 4;
                        lVar17 = lVar17 + 1;
                      } while (lVar17 != 4);
                    }
                    pTVar8 = local_300;
                    uVar19 = (int)pTVar6 + 1;
                    pTVar6 = (TestNode *)(ulong)uVar19;
                  } while (uVar19 != 9);
                  lVar17 = local_228 + 1;
                } while (local_228 == 0);
              } while ((local_30c == 0) && (iVar5 = 1, local_394 == TEXTURETYPE_CUBE));
              if (bVar24 || gatherType == GATHERTYPE_OFFSETS) {
                CVar1 = formats[lVar7].format.order;
                pTVar6 = local_300;
                if ((CVar1 != D) && (CVar1 != DS)) {
                  node = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)node,local_390->m_testCtx,"texture_swizzle","");
                  tcu::TestNode::addChild(pTVar8,node);
                  uVar22 = 0;
                  do {
                    caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                    swizzle_1.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_R;
                    swizzle_1.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_G;
                    swizzle_1.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_B;
                    swizzle_1.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_A;
                    swizzle_1.m_isSome = true;
                    caseName_1._M_string_length = 0;
                    caseName_1.field_2._M_allocated_capacity =
                         caseName_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    uVar18 = uVar22 & 0xffffffff;
                    lVar17 = 0;
                    do {
                      comp = (int)uVar18 + (int)(uVar18 / 6) * -6;
                      swizzle_1.m_swizzle.m_data[lVar17] = comp;
                      pcVar16 = "";
                      if (lVar17 != 0) {
                        pcVar16 = "_";
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
                      anon_unknown_0::operator<<((ostream *)&caseName,comp);
                      std::__cxx11::stringbuf::str();
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
                      std::ios_base::~ios_base(local_1b0);
                      de::toLower((string *)&swizzle,&local_330);
                      plVar9 = (long *)std::__cxx11::string::replace
                                                 ((ulong)&swizzle,0,(char *)0x0,(ulong)pcVar16);
                      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                      psVar13 = (size_type *)(plVar9 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar13) {
                        local_3b8.field_2._M_allocated_capacity = *psVar13;
                        local_3b8.field_2._8_8_ = plVar9[3];
                      }
                      else {
                        local_3b8.field_2._M_allocated_capacity = *psVar13;
                        local_3b8._M_dataplus._M_p = (pointer)*plVar9;
                      }
                      local_3b8._M_string_length = plVar9[1];
                      *plVar9 = (long)psVar13;
                      plVar9[1] = 0;
                      *(undefined1 *)(plVar9 + 2) = 0;
                      std::__cxx11::string::_M_append
                                ((char *)&caseName_1,(ulong)local_3b8._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                        operator_delete(local_3b8._M_dataplus._M_p,
                                        local_3b8.field_2._M_allocated_capacity + 1);
                      }
                      if ((bool *)swizzle.m_swizzle.m_data._0_8_ != &swizzle.m_isSome) {
                        operator_delete((void *)swizzle.m_swizzle.m_data._0_8_,
                                        stack0xfffffffffffffcb8 + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_330._M_dataplus._M_p != &local_330.field_2) {
                        operator_delete(local_330._M_dataplus._M_p,
                                        CONCAT71(local_330.field_2._M_allocated_capacity._1_7_,
                                                 local_330.field_2._M_local_buf[0]) + 1);
                      }
                      lVar17 = lVar17 + 1;
                      uVar18 = (ulong)((int)uVar18 + 1);
                    } while (lVar17 != 4);
                    pTVar3 = local_390->m_testCtx;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&caseName,caseName_1._M_dataplus._M_p,
                               (allocator<char> *)&local_330);
                    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
                    TVar4 = formats[lVar7].format;
                    swizzle.m_swizzle.m_data[0] = 0x40;
                    swizzle.m_swizzle.m_data[1] = 0x40;
                    swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_A;
                    pTVar6 = (TestNode *)
                             makeTextureGatherCase
                                       (local_394,pTVar3,&caseName,&local_3b8,gatherType,local_398,
                                        TVar4,COMPAREMODE_NONE,REPEAT_GL,REPEAT_GL,&swizzle_1,
                                        NEAREST,NEAREST,0,(IVec3 *)&swizzle,0,
                                        IMAGE_BACKING_MODE_REGULAR);
                    tcu::TestNode::addChild(node,pTVar6);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                      operator_delete(local_3b8._M_dataplus._M_p,
                                      local_3b8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)caseName._M_dataplus._M_p != &caseName.field_2) {
                      operator_delete(caseName._M_dataplus._M_p,
                                      caseName.field_2._M_allocated_capacity + 1);
                    }
                    pTVar3 = local_390->m_testCtx;
                    std::operator+(&caseName,"sparse_",&caseName_1);
                    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
                    swizzle.m_swizzle.m_data[0] = 0x40;
                    swizzle.m_swizzle.m_data[1] = 0x40;
                    swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_A;
                    pTVar6 = (TestNode *)
                             makeTextureGatherCase
                                       (local_394,pTVar3,&caseName,&local_3b8,gatherType,local_398,
                                        TVar4,COMPAREMODE_NONE,REPEAT_GL,REPEAT_GL,&swizzle_1,
                                        NEAREST,NEAREST,0,(IVec3 *)&swizzle,0,
                                        IMAGE_BACKING_MODE_SPARSE);
                    tcu::TestNode::addChild(node,pTVar6);
                    pTVar6 = local_300;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                      operator_delete(local_3b8._M_dataplus._M_p,
                                      local_3b8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)caseName._M_dataplus._M_p != &caseName.field_2) {
                      operator_delete(caseName._M_dataplus._M_p,
                                      caseName.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                      operator_delete(caseName_1._M_dataplus._M_p,
                                      caseName_1.field_2._M_allocated_capacity + 1);
                    }
                    uVar22 = uVar22 + 1;
                  } while (uVar22 != 6);
                }
                pTVar8 = (TestNode *)operator_new(0x70);
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar8,local_390->m_testCtx,"filter_mode",
                           "Test that filter modes have no effect");
                tcu::TestNode::addChild(pTVar6,pTVar8);
                pIVar10 = (IVec3 *)0x0;
                local_308 = pTVar8;
                do {
                  local_2f0 = (TestNode *)(&DAT_00d26d30 + (long)pIVar10 * 2);
                  minFilter = (&DAT_00d26d38)[(long)pIVar10 * 4];
                  lVar17 = 0;
                  local_2f8 = pIVar10;
                  do {
                    paVar23 = &caseName_1.field_2;
                    magFilter = *(FilterMode *)((long)&DAT_00d26d18 + lVar17);
                    CVar2 = formats[lVar7].format.type;
                    bVar25 = (formats[lVar7].format.order - D & 0xfffffffd) == 0;
                    if ((CVar2 < UNORM_BYTE_44) && ((0x58U >> (CVar2 & UNSIGNED_INT16) & 1) != 0)) {
                      if (magFilter != NEAREST) {
LAB_00632ccc:
                        if ((CVar2 < HALF_FLOAT) &&
                           ((0x2c0000000U >> ((ulong)CVar2 & 0x3f) & 1) != 0)) {
                          if ((magFilter == NEAREST) && (minFilter == NEAREST_MIPMAP_NEAREST)) {
LAB_00632cfb:
                            local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                            local_330._M_string_length = 0;
                            local_330.field_2._M_local_buf[0] = '\0';
                            plVar9 = (long *)std::__cxx11::string::append((char *)&local_330);
                            swizzle.m_swizzle.m_data._0_8_ = &swizzle.m_isSome;
                            puVar14 = (ulong *)(plVar9 + 2);
                            if ((ulong *)*plVar9 == puVar14) {
                              unique0x100015b7 = *puVar14;
                            }
                            else {
                              unique0x00012000 = *puVar14;
                              swizzle.m_swizzle.m_data._0_8_ = (ulong *)*plVar9;
                            }
                            swizzle.m_swizzle.m_data._8_8_ = plVar9[1];
                            *plVar9 = (long)puVar14;
                            plVar9[1] = 0;
                            *(undefined1 *)(plVar9 + 2) = 0;
                            plVar9 = (long *)std::__cxx11::string::append((char *)&swizzle);
                            local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                            psVar13 = (size_type *)(plVar9 + 2);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*plVar9 ==
                                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)psVar13) {
                              local_3b8.field_2._M_allocated_capacity = *psVar13;
                              local_3b8.field_2._8_8_ = plVar9[3];
                            }
                            else {
                              local_3b8.field_2._M_allocated_capacity = *psVar13;
                              local_3b8._M_dataplus._M_p = (pointer)*plVar9;
                            }
                            local_3b8._M_string_length = plVar9[1];
                            *plVar9 = (long)psVar13;
                            plVar9[1] = 0;
                            *(undefined1 *)(plVar9 + 2) = 0;
                            plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b8);
                            psVar13 = (size_type *)(plVar9 + 2);
                            if ((size_type *)*plVar9 == psVar13) {
                              caseName_1.field_2._M_allocated_capacity = *psVar13;
                              caseName_1.field_2._8_8_ = plVar9[3];
                              caseName_1._M_dataplus._M_p = (pointer)paVar23;
                            }
                            else {
                              caseName_1.field_2._M_allocated_capacity = *psVar13;
                              caseName_1._M_dataplus._M_p = (pointer)*plVar9;
                            }
                            caseName_1._M_string_length = plVar9[1];
                            *plVar9 = (long)psVar13;
                            plVar9[1] = 0;
                            *(undefined1 *)(plVar9 + 2) = 0;
                            plVar9 = (long *)std::__cxx11::string::append((char *)&caseName_1);
                            caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
                            psVar13 = (size_type *)(plVar9 + 2);
                            if ((size_type *)*plVar9 == psVar13) {
                              caseName.field_2._M_allocated_capacity = *psVar13;
                              caseName.field_2._8_8_ = plVar9[3];
                            }
                            else {
                              caseName.field_2._M_allocated_capacity = *psVar13;
                              caseName._M_dataplus._M_p = (pointer)*plVar9;
                            }
                            caseName._M_string_length = plVar9[1];
                            *plVar9 = (long)psVar13;
                            plVar9[1] = 0;
                            *(undefined1 *)(plVar9 + 2) = 0;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName_1._M_dataplus._M_p != paVar23) {
                              operator_delete(caseName_1._M_dataplus._M_p,
                                              caseName_1.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                              operator_delete(local_3b8._M_dataplus._M_p,
                                              local_3b8.field_2._M_allocated_capacity + 1);
                            }
                            if ((bool *)swizzle.m_swizzle.m_data._0_8_ != &swizzle.m_isSome) {
                              operator_delete((void *)swizzle.m_swizzle.m_data._0_8_,
                                              stack0xfffffffffffffcb8 + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
                              operator_delete(local_330._M_dataplus._M_p,
                                              CONCAT71(local_330.field_2._M_allocated_capacity._1_7_
                                                       ,local_330.field_2._M_local_buf[0]) + 1);
                            }
                            pTVar3 = local_390->m_testCtx;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&caseName_1,caseName._M_dataplus._M_p,
                                       (allocator<char> *)&swizzle_1);
                            local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"")
                            ;
                            TVar4 = formats[lVar7].format;
                            swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                            stack0xfffffffffffffcb8 = stack0xfffffffffffffcb8 & 0xffffffffffffff00;
                            local_330._M_dataplus._M_p = (pointer)0x4000000040;
                            local_330._M_string_length =
                                 CONCAT44(local_330._M_string_length._4_4_,3);
                            pTVar6 = (TestNode *)
                                     makeTextureGatherCase
                                               (local_394,pTVar3,&caseName_1,&local_3b8,gatherType,
                                                local_398,TVar4,(uint)bVar25,REPEAT_GL,REPEAT_GL,
                                                &swizzle,minFilter,magFilter,0,(IVec3 *)&local_330,0
                                                ,IMAGE_BACKING_MODE_REGULAR);
                            tcu::TestNode::addChild(local_308,pTVar6);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                              operator_delete(local_3b8._M_dataplus._M_p,
                                              local_3b8.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName_1._M_dataplus._M_p != paVar23) {
                              operator_delete(caseName_1._M_dataplus._M_p,
                                              caseName_1.field_2._M_allocated_capacity + 1);
                            }
                            pTVar3 = local_390->m_testCtx;
                            std::operator+(&caseName_1,"sparse_",&caseName);
                            local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"")
                            ;
                            swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                            swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                            stack0xfffffffffffffcb8 = stack0xfffffffffffffcb8 & 0xffffffffffffff00;
                            local_330._M_dataplus._M_p = (pointer)0x4000000040;
                            local_330._M_string_length =
                                 CONCAT44(local_330._M_string_length._4_4_,3);
                            pTVar6 = (TestNode *)
                                     makeTextureGatherCase
                                               (local_394,pTVar3,&caseName_1,&local_3b8,gatherType,
                                                local_398,TVar4,(uint)bVar25,REPEAT_GL,REPEAT_GL,
                                                &swizzle,minFilter,magFilter,0,(IVec3 *)&local_330,0
                                                ,IMAGE_BACKING_MODE_SPARSE);
                            tcu::TestNode::addChild(local_308,pTVar6);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                              operator_delete(local_3b8._M_dataplus._M_p,
                                              local_3b8.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                              operator_delete(caseName_1._M_dataplus._M_p,
                                              caseName_1.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)caseName._M_dataplus._M_p != &caseName.field_2) {
                              operator_delete(caseName._M_dataplus._M_p,
                                              caseName.field_2._M_allocated_capacity + 1);
                            }
                          }
                        }
                        else if ((2 < CVar2 - SIGNED_INT8) ||
                                (minFilter == NEAREST_MIPMAP_NEAREST && magFilter == NEAREST))
                        goto LAB_00632cfb;
                      }
                    }
                    else if (!bVar25 || magFilter != NEAREST) goto LAB_00632ccc;
                    lVar17 = lVar17 + 0x10;
                  } while (lVar17 == 0x10);
                  pIVar10 = (IVec3 *)((long)local_2f8->m_data + 1);
                } while (pIVar10 != (IVec3 *)0x5);
                pTVar6 = (TestNode *)operator_new(0x70);
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar6,local_390->m_testCtx,"base_level","");
                tcu::TestNode::addChild(local_300,pTVar6);
                iVar5 = 1;
                do {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
                  std::ostream::operator<<(&caseName,iVar5);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
                  std::ios_base::~ios_base(local_1b0);
                  plVar9 = (long *)std::__cxx11::string::replace
                                             ((ulong)&local_3b8,0,(char *)0x0,0xb25c51);
                  psVar13 = (size_type *)(plVar9 + 2);
                  if ((size_type *)*plVar9 == psVar13) {
                    caseName_1.field_2._M_allocated_capacity = *psVar13;
                    caseName_1.field_2._8_8_ = plVar9[3];
                    caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                  }
                  else {
                    caseName_1.field_2._M_allocated_capacity = *psVar13;
                    caseName_1._M_dataplus._M_p = (pointer)*plVar9;
                  }
                  caseName_1._M_string_length = plVar9[1];
                  *plVar9 = (long)psVar13;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                    operator_delete(local_3b8._M_dataplus._M_p,
                                    local_3b8.field_2._M_allocated_capacity + 1);
                  }
                  bVar25 = (formats[lVar7].format.order - D & 0xfffffffd) == 0;
                  pTVar3 = local_390->m_testCtx;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&caseName,caseName_1._M_dataplus._M_p,
                             (allocator<char> *)&swizzle_1);
                  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
                  TVar4 = formats[lVar7].format;
                  swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                  stack0xfffffffffffffcb8 = stack0xfffffffffffffcb8 & 0xffffffffffffff00;
                  local_330._M_dataplus._M_p = (pointer)0x4000000040;
                  local_330._M_string_length = CONCAT44(local_330._M_string_length._4_4_,3);
                  pTVar8 = (TestNode *)
                           makeTextureGatherCase
                                     (local_394,pTVar3,&caseName,&local_3b8,gatherType,local_398,
                                      TVar4,(uint)bVar25,REPEAT_GL,REPEAT_GL,&swizzle,NEAREST,
                                      NEAREST,iVar5,(IVec3 *)&local_330,0,IMAGE_BACKING_MODE_REGULAR
                                     );
                  tcu::TestNode::addChild(pTVar6,pTVar8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                    operator_delete(local_3b8._M_dataplus._M_p,
                                    local_3b8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)caseName._M_dataplus._M_p != &caseName.field_2) {
                    operator_delete(caseName._M_dataplus._M_p,
                                    caseName.field_2._M_allocated_capacity + 1);
                  }
                  pTVar3 = local_390->m_testCtx;
                  std::operator+(&caseName,"sparse_",&caseName_1);
                  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
                  swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_LAST;
                  swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_LAST;
                  stack0xfffffffffffffcb8 = stack0xfffffffffffffcb8 & 0xffffffffffffff00;
                  local_330._M_dataplus._M_p = (pointer)0x4000000040;
                  local_330._M_string_length = CONCAT44(local_330._M_string_length._4_4_,3);
                  pTVar8 = (TestNode *)
                           makeTextureGatherCase
                                     (local_394,pTVar3,&caseName,&local_3b8,gatherType,local_398,
                                      TVar4,(uint)bVar25,REPEAT_GL,REPEAT_GL,&swizzle,NEAREST,
                                      NEAREST,iVar5,(IVec3 *)&local_330,0,IMAGE_BACKING_MODE_SPARSE)
                  ;
                  tcu::TestNode::addChild(pTVar6,pTVar8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                    operator_delete(local_3b8._M_dataplus._M_p,
                                    local_3b8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)caseName._M_dataplus._M_p != &caseName.field_2) {
                    operator_delete(caseName._M_dataplus._M_p,
                                    caseName.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)caseName_1._M_dataplus._M_p != &caseName_1.field_2) {
                    operator_delete(caseName_1._M_dataplus._M_p,
                                    caseName_1.field_2._M_allocated_capacity + 1);
                  }
                  iVar5 = iVar5 + 1;
                } while (iVar5 != 3);
              }
              lVar7 = local_250 + 1;
            } while (lVar7 != 4);
          }
          lVar7 = local_238 + 1;
        } while (lVar7 != 3);
        uVar22 = 3;
        OVar15 = local_398;
      }
      OVar15 = OVar15 + OFFSETSIZE_MINIMUM_REQUIRED;
    } while (OVar15 != OFFSETSIZE_LAST);
    gatherType = gatherType + GATHERTYPE_OFFSET;
    if (gatherType == GATHERTYPE_LAST) {
      return (int)uVar22;
    }
  } while( true );
}

Assistant:

void TextureGatherTests::init (void)
{
	const struct
	{
		const char* name;
		TextureType type;
	} textureTypes[] =
	{
		{ "2d",			TEXTURETYPE_2D			},
		{ "2d_array",	TEXTURETYPE_2D_ARRAY	},
		{ "cube",		TEXTURETYPE_CUBE		}
	};

	const struct
	{
		const char*			name;
		tcu::TextureFormat	format;
	} formats[] =
	{
		{ "rgba8",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)		},
		{ "rgba8ui",	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8)	},
		{ "rgba8i",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8)	},
		{ "depth32f",	tcu::TextureFormat(tcu::TextureFormat::D,		tcu::TextureFormat::FLOAT)			}
	};

	const struct
	{
		const char*		name;
		IVec3			size;
	} textureSizes[] =
	{
		{ "size_pot",	IVec3(64, 64, 3) },
		{ "size_npot",	IVec3(17, 23, 3) }
	};

	const struct
	{
		const char*				name;
		tcu::Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp_to_edge",		tcu::Sampler::CLAMP_TO_EDGE			},
		{ "repeat",				tcu::Sampler::REPEAT_GL				},
		{ "mirrored_repeat",	tcu::Sampler::MIRRORED_REPEAT_GL	}
	};

	for (int gatherTypeI = 0; gatherTypeI < GATHERTYPE_LAST; gatherTypeI++)
	{
		const GatherType		gatherType			= (GatherType)gatherTypeI;
		TestCaseGroup* const	gatherTypeGroup		= new TestCaseGroup(m_testCtx, gatherTypeName(gatherType), gatherTypeDescription(gatherType));
		addChild(gatherTypeGroup);

		for (int offsetSizeI = 0; offsetSizeI < OFFSETSIZE_LAST; offsetSizeI++)
		{
			const OffsetSize offsetSize = (OffsetSize)offsetSizeI;
			if ((gatherType == GATHERTYPE_BASIC) != (offsetSize == OFFSETSIZE_NONE))
				continue;

			if (gatherType == GATHERTYPE_OFFSETS && offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) // \note offsets argument must be compile-time constant
				continue;

			TestCaseGroup* const offsetSizeGroup = offsetSize == OFFSETSIZE_NONE ?
													gatherTypeGroup :
													new TestCaseGroup(m_testCtx,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "min_required_offset"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "implementation_offset"
																	  : DE_NULL,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "Use offsets within Vulkan minimum required range"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "Use offsets within the implementation range"
																	  : DE_NULL);

			if (offsetSizeGroup != gatherTypeGroup)
				gatherTypeGroup->addChild(offsetSizeGroup);

			for (int textureTypeNdx = 0; textureTypeNdx < DE_LENGTH_OF_ARRAY(textureTypes); textureTypeNdx++)
			{
				const TextureType textureType = textureTypes[textureTypeNdx].type;

				if (textureType == TEXTURETYPE_CUBE && gatherType != GATHERTYPE_BASIC)
					continue;

				TestCaseGroup* const textureTypeGroup = new TestCaseGroup(m_testCtx, textureTypes[textureTypeNdx].name, "");
				offsetSizeGroup->addChild(textureTypeGroup);

				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format			= formats[formatNdx].format;
					TestCaseGroup* const		formatGroup		= new TestCaseGroup(m_testCtx, formats[formatNdx].name, "");
					textureTypeGroup->addChild(formatGroup);

					for (int noCornersI = 0; noCornersI <= ((textureType == TEXTURETYPE_CUBE)?1:0); noCornersI++)
					{
						const bool				noCorners		= noCornersI!= 0;
						TestCaseGroup* const	cornersGroup	= noCorners
																? new TestCaseGroup(m_testCtx, "no_corners", "Test case variants that don't sample around cube map corners")
																: formatGroup;

						if (formatGroup != cornersGroup)
							formatGroup->addChild(cornersGroup);

						for (int textureSizeNdx = 0; textureSizeNdx < DE_LENGTH_OF_ARRAY(textureSizes); textureSizeNdx++)
						{
							const IVec3&			textureSize			= textureSizes[textureSizeNdx].size;
							TestCaseGroup* const	textureSizeGroup	= new TestCaseGroup(m_testCtx, textureSizes[textureSizeNdx].name, "");
							cornersGroup->addChild(textureSizeGroup);

							for (int compareModeI = 0; compareModeI < tcu::Sampler::COMPAREMODE_LAST; compareModeI++)
							{
								const tcu::Sampler::CompareMode compareMode = (tcu::Sampler::CompareMode)compareModeI;

								if ((compareMode != tcu::Sampler::COMPAREMODE_NONE) != isDepthFormat(format))
									continue;

								if (compareMode != tcu::Sampler::COMPAREMODE_NONE &&
									compareMode != tcu::Sampler::COMPAREMODE_LESS &&
									compareMode != tcu::Sampler::COMPAREMODE_GREATER)
									continue;

								TestCaseGroup* const compareModeGroup = compareMode == tcu::Sampler::COMPAREMODE_NONE ?
																			textureSizeGroup :
																			new TestCaseGroup(m_testCtx,
																							  (string() + "compare_" + compareModeName(compareMode)).c_str(),
																							  "");
								if (compareModeGroup != textureSizeGroup)
									textureSizeGroup->addChild(compareModeGroup);

								for (int wrapCaseNdx = 0; wrapCaseNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapCaseNdx++)
								{
									const int						wrapSNdx	= wrapCaseNdx;
									const int						wrapTNdx	= (wrapCaseNdx + 1) % DE_LENGTH_OF_ARRAY(wrapModes);
									const tcu::Sampler::WrapMode	wrapS		= wrapModes[wrapSNdx].mode;
									const tcu::Sampler::WrapMode	wrapT		= wrapModes[wrapTNdx].mode;

									const string caseName = string() + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0));
									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
								}
							}
						}
					}

					if (offsetSize != OFFSETSIZE_MINIMUM_REQUIRED || gatherType == GATHERTYPE_OFFSETS) // Don't test all features for both offset size types, as they should be rather orthogonal.
					{
						if (!isDepthFormat(format))
						{
							TestCaseGroup* const swizzleGroup = new TestCaseGroup(m_testCtx, "texture_swizzle", "");
							formatGroup->addChild(swizzleGroup);

							DE_STATIC_ASSERT(TEXTURESWIZZLECOMPONENT_R == 0);
							for (int swizzleCaseNdx = 0; swizzleCaseNdx < TEXTURESWIZZLECOMPONENT_LAST; swizzleCaseNdx++)
							{
								MaybeTextureSwizzle	swizzle	= MaybeTextureSwizzle::createSomeTextureSwizzle();
								string				caseName;

								for (int i = 0; i < 4; i++)
								{
									swizzle.getSwizzle()[i] = (TextureSwizzleComponent)((swizzleCaseNdx + i) % (int)TEXTURESWIZZLECOMPONENT_LAST);
									caseName += (i > 0 ? "_" : "") + de::toLower(de::toString(swizzle.getSwizzle()[i]));
								}

								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3)));
								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}

						{
							TestCaseGroup* const filterModeGroup = new TestCaseGroup(m_testCtx, "filter_mode", "Test that filter modes have no effect");
							formatGroup->addChild(filterModeGroup);

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} magFilters[] =
							{
								{ "linear",		tcu::Sampler::LINEAR	},
								{ "nearest",	tcu::Sampler::NEAREST	}
							};

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} minFilters[] =
							{
								// \note Don't test NEAREST here, as it's covered by other cases.
								{ "linear",						tcu::Sampler::LINEAR					},
								{ "nearest_mipmap_nearest",		tcu::Sampler::NEAREST_MIPMAP_NEAREST	},
								{ "nearest_mipmap_linear",		tcu::Sampler::NEAREST_MIPMAP_LINEAR		},
								{ "linear_mipmap_nearest",		tcu::Sampler::LINEAR_MIPMAP_NEAREST		},
								{ "linear_mipmap_linear",		tcu::Sampler::LINEAR_MIPMAP_LINEAR		},
							};

							for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
							for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
							{
								const tcu::Sampler::FilterMode		minFilter		= minFilters[minFilterNdx].filter;
								const tcu::Sampler::FilterMode		magFilter		= magFilters[magFilterNdx].filter;
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;

								if ((isUnormFormatType(format.type) || isDepthFormat(format)) && magFilter == tcu::Sampler::NEAREST)
									continue; // Covered by other cases.
								if ((isUIntFormatType(format.type) || isSIntFormatType(format.type)) &&
									(magFilter != tcu::Sampler::NEAREST || minFilter != tcu::Sampler::NEAREST_MIPMAP_NEAREST))
									continue;

								const string caseName = string() + "min_" + minFilters[minFilterNdx].name + "_mag_" + magFilters[magFilterNdx].name;

								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3)));
								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}

						{
							TestCaseGroup* const baseLevelGroup = new TestCaseGroup(m_testCtx, "base_level", "");
							formatGroup->addChild(baseLevelGroup);

							for (int baseLevel = 1; baseLevel <= 2; baseLevel++)
							{
								const string						caseName		= "level_" + de::toString(baseLevel);
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, caseName.c_str(), "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3)));
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_testCtx, "sparse_" + caseName, "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3), 0, ShaderRenderCaseInstance::IMAGE_BACKING_MODE_SPARSE));
							}
						}
					}
				}
			}
		}
	}
}